

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_debug.cpp
# Opt level: O3

spv_result_t spvtools::val::DebugPass(ValidationState_t *_,Instruction *inst)

{
  uint16_t uVar1;
  uint uVar2;
  Instruction *pIVar3;
  long lVar4;
  spv_result_t sVar5;
  char *pcVar6;
  string local_240;
  string local_220;
  DiagnosticStream local_200;
  
  uVar1 = (inst->inst_).opcode;
  if (uVar1 == 8) {
    uVar2 = Instruction::GetOperandAs<unsigned_int>(inst,0);
    pIVar3 = ValidationState_t::FindDef(_,uVar2);
    if ((pIVar3 != (Instruction *)0x0) && ((pIVar3->inst_).opcode == 7)) {
      return SPV_SUCCESS;
    }
    ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_ID,inst);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_200,"OpLine Target <id> ",0x13);
    ValidationState_t::getIdName_abi_cxx11_(&local_240,_,uVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_200,local_240._M_dataplus._M_p,local_240._M_string_length);
    pcVar6 = " is not an OpString.";
    lVar4 = 0x14;
  }
  else {
    if (uVar1 != 6) {
      return SPV_SUCCESS;
    }
    uVar2 = Instruction::GetOperandAs<unsigned_int>(inst,0);
    pIVar3 = ValidationState_t::FindDef(_,uVar2);
    if ((pIVar3 != (Instruction *)0x0) && ((pIVar3->inst_).opcode == 0x1e)) {
      uVar2 = Instruction::GetOperandAs<unsigned_int>(inst,1);
      if (uVar2 < (int)((ulong)((long)(pIVar3->words_).
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pIVar3->words_).
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 2) - 2U) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_200,"OpMemberName Member <id> ",0x19);
      ValidationState_t::getIdName_abi_cxx11_(&local_240,_,uVar2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_200,local_240._M_dataplus._M_p,local_240._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_200," index is larger than Type <id> ",0x20);
      ValidationState_t::getIdName_abi_cxx11_(&local_220,_,(pIVar3->inst_).result_id);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_200,local_220._M_dataplus._M_p,local_220._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_200,"s member count.",0xf);
      sVar5 = local_200.error_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != &local_220.field_2) {
        operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
      }
      goto LAB_00164c3e;
    }
    ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_ID,inst);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_200,"OpMemberName Type <id> ",0x17);
    ValidationState_t::getIdName_abi_cxx11_(&local_240,_,uVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_200,local_240._M_dataplus._M_p,local_240._M_string_length);
    pcVar6 = " is not a struct type.";
    lVar4 = 0x16;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_200,pcVar6,lVar4);
  sVar5 = local_200.error_;
LAB_00164c3e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
  }
  DiagnosticStream::~DiagnosticStream(&local_200);
  if (sVar5 == SPV_SUCCESS) {
    return SPV_SUCCESS;
  }
  return sVar5;
}

Assistant:

spv_result_t DebugPass(ValidationState_t& _, const Instruction* inst) {
  switch (inst->opcode()) {
    case spv::Op::OpMemberName:
      if (auto error = ValidateMemberName(_, inst)) return error;
      break;
    case spv::Op::OpLine:
      if (auto error = ValidateLine(_, inst)) return error;
      break;
    default:
      break;
  }

  return SPV_SUCCESS;
}